

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error FT_New_Size(FT_Face face,FT_Size *asize)

{
  FT_Memory memory;
  FT_Driver_Class pFVar1;
  FT_Error FVar2;
  FT_Size pFVar3;
  FT_ListNode node;
  FT_Size_Internal pFVar4;
  int local_3c;
  FT_Driver_Class local_38;
  
  if (face == (FT_Face)0x0) {
    FVar2 = 0x23;
  }
  else if (asize == (FT_Size *)0x0) {
    FVar2 = 6;
  }
  else if (face->driver == (FT_Driver)0x0) {
    FVar2 = 0x22;
  }
  else {
    *asize = (FT_Size)0x0;
    memory = face->memory;
    pFVar1 = face->driver->clazz;
    pFVar3 = (FT_Size)ft_mem_alloc(memory,pFVar1->size_object_size,&local_3c);
    FVar2 = local_3c;
    if (local_3c == 0) {
      local_38 = pFVar1;
      node = (FT_ListNode)ft_mem_alloc(memory,0x18,&local_3c);
      FVar2 = local_3c;
      if (local_3c == 0) {
        pFVar3->face = face;
        pFVar4 = (FT_Size_Internal)ft_mem_alloc(memory,0x48,&local_3c);
        FVar2 = local_3c;
        if (local_3c == 0) {
          pFVar3->internal = pFVar4;
          if ((local_38->init_size == (FT_Size_InitFunc)0x0) ||
             (FVar2 = (*local_38->init_size)(pFVar3), FVar2 == 0)) {
            *asize = pFVar3;
            node->data = pFVar3;
            FT_List_Add(&face->sizes_list,node);
            return 0;
          }
        }
      }
      if (node != (FT_ListNode)0x0) {
        (*memory->free)(memory,node);
      }
    }
    if (pFVar3 != (FT_Size)0x0) {
      (*memory->free)(memory,pFVar3);
    }
  }
  return FVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_New_Size( FT_Face   face,
               FT_Size  *asize )
  {
    FT_Error         error;
    FT_Memory        memory;
    FT_Driver        driver;
    FT_Driver_Class  clazz;

    FT_Size          size = NULL;
    FT_ListNode      node = NULL;

    FT_Size_Internal  internal = NULL;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !asize )
      return FT_THROW( Invalid_Argument );

    if ( !face->driver )
      return FT_THROW( Invalid_Driver_Handle );

    *asize = NULL;

    driver = face->driver;
    clazz  = driver->clazz;
    memory = face->memory;

    /* Allocate new size object and perform basic initialisation */
    if ( FT_ALLOC( size, clazz->size_object_size ) || FT_NEW( node ) )
      goto Exit;

    size->face = face;

    if ( FT_NEW( internal ) )
      goto Exit;

    size->internal = internal;

    if ( clazz->init_size )
      error = clazz->init_size( size );

    /* in case of success, add to the face's list */
    if ( !error )
    {
      *asize     = size;
      node->data = size;
      FT_List_Add( &face->sizes_list, node );
    }

  Exit:
    if ( error )
    {
      FT_FREE( node );
      FT_FREE( size );
    }

    return error;
  }